

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

int av1_vector_match(int16_t *ref,int16_t *src,int bwl,int search_size,int full_search,int *sad)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int16_t *piVar10;
  int iVar11;
  uint uVar12;
  
  uVar2 = search_size * 2;
  if (full_search == 0) {
    iVar11 = 0x7fffffff;
    if ((int)uVar2 < 0) {
      uVar6 = 0;
      iVar11 = 0x7fffffff;
    }
    else {
      uVar12 = 0;
      uVar6 = 0;
      piVar10 = ref;
      do {
        iVar3 = (*aom_vector_var)(piVar10,src,bwl);
        if (iVar3 < iVar11) {
          iVar11 = iVar3;
          uVar6 = uVar12;
        }
        piVar10 = piVar10 + 0x10;
        uVar12 = uVar12 + 0x10;
      } while ((int)uVar12 <= (int)uVar2);
    }
    iVar8 = -0x18;
    iVar3 = iVar11;
    uVar12 = uVar6;
    do {
      uVar5 = uVar6 + iVar8 + 0x10;
      if (((int)uVar5 <= (int)uVar2 && -1 < (int)uVar5) &&
         (iVar4 = (*aom_vector_var)(ref + uVar5,src,bwl), bVar1 = iVar4 < iVar11, iVar11 = iVar3,
         bVar1)) {
        iVar11 = iVar4;
        iVar3 = iVar4;
        uVar12 = uVar5;
      }
      iVar8 = iVar8 + 0x10;
    } while (iVar8 < -7);
    iVar8 = -0xc;
    uVar6 = uVar12;
    do {
      uVar5 = uVar12 + iVar8 + 8;
      if (((int)uVar5 <= (int)uVar2 && -1 < (int)uVar5) &&
         (iVar4 = (*aom_vector_var)(ref + uVar5,src,bwl), bVar1 = iVar4 < iVar11, iVar11 = iVar3,
         bVar1)) {
        iVar11 = iVar4;
        iVar3 = iVar4;
        uVar6 = uVar5;
      }
      iVar8 = iVar8 + 8;
    } while (iVar8 < -3);
    iVar8 = -6;
    uVar12 = uVar6;
    do {
      uVar5 = iVar8 + uVar6 + 4;
      if (((int)uVar5 <= (int)uVar2 && -1 < (int)uVar5) &&
         (iVar4 = (*aom_vector_var)(ref + uVar5,src,bwl), bVar1 = iVar4 < iVar11, iVar11 = iVar3,
         bVar1)) {
        iVar11 = iVar4;
        iVar3 = iVar4;
        uVar12 = uVar5;
      }
      iVar8 = iVar8 + 4;
    } while (iVar8 < -1);
    iVar8 = -3;
    uVar6 = uVar12;
    do {
      uVar5 = iVar8 + uVar12 + 2;
      if (((int)uVar5 <= (int)uVar2 && -1 < (int)uVar5) &&
         (iVar4 = (*aom_vector_var)(ref + uVar5,src,bwl), bVar1 = iVar4 < iVar11, iVar11 = iVar3,
         bVar1)) {
        iVar11 = iVar4;
        iVar3 = iVar4;
        uVar6 = uVar5;
      }
      iVar8 = iVar8 + 2;
    } while (iVar8 < 0);
  }
  else if ((int)uVar2 < 0) {
    uVar6 = 0;
    iVar11 = 0x7fffffff;
  }
  else {
    uVar7 = 0;
    iVar11 = 0x7fffffff;
    uVar9 = 0;
    do {
      iVar3 = (*aom_vector_var)(ref,src,bwl);
      if (iVar3 < iVar11) {
        uVar9 = uVar7 & 0xffffffff;
      }
      uVar6 = (uint)uVar9;
      if (iVar3 < iVar11) {
        iVar11 = iVar3;
      }
      uVar7 = uVar7 + 1;
      ref = ref + 1;
    } while ((ulong)uVar2 + 1 != uVar7);
  }
  *sad = iVar11;
  return uVar6 - ((int)uVar2 >> 1);
}

Assistant:

int av1_vector_match(const int16_t *ref, const int16_t *src, int bwl,
                     int search_size, int full_search, int *sad) {
  int best_sad = INT_MAX;
  int this_sad;
  int d;
  int center, offset = 0;
  int bw = search_size << 1;

  if (full_search) {
    for (d = 0; d <= bw; d++) {
      this_sad = aom_vector_var(&ref[d], src, bwl);
      if (this_sad < best_sad) {
        best_sad = this_sad;
        offset = d;
      }
    }
    center = offset;
    *sad = best_sad;
    return (center - (bw >> 1));
  }

  for (d = 0; d <= bw; d += 16) {
    this_sad = aom_vector_var(&ref[d], src, bwl);
    if (this_sad < best_sad) {
      best_sad = this_sad;
      offset = d;
    }
  }
  center = offset;

  for (d = -8; d <= 8; d += 16) {
    int this_pos = offset + d;
    // check limit
    if (this_pos < 0 || this_pos > bw) continue;
    this_sad = aom_vector_var(&ref[this_pos], src, bwl);
    if (this_sad < best_sad) {
      best_sad = this_sad;
      center = this_pos;
    }
  }
  offset = center;

  for (d = -4; d <= 4; d += 8) {
    int this_pos = offset + d;
    // check limit
    if (this_pos < 0 || this_pos > bw) continue;
    this_sad = aom_vector_var(&ref[this_pos], src, bwl);
    if (this_sad < best_sad) {
      best_sad = this_sad;
      center = this_pos;
    }
  }
  offset = center;

  for (d = -2; d <= 2; d += 4) {
    int this_pos = offset + d;
    // check limit
    if (this_pos < 0 || this_pos > bw) continue;
    this_sad = aom_vector_var(&ref[this_pos], src, bwl);
    if (this_sad < best_sad) {
      best_sad = this_sad;
      center = this_pos;
    }
  }
  offset = center;

  for (d = -1; d <= 1; d += 2) {
    int this_pos = offset + d;
    // check limit
    if (this_pos < 0 || this_pos > bw) continue;
    this_sad = aom_vector_var(&ref[this_pos], src, bwl);
    if (this_sad < best_sad) {
      best_sad = this_sad;
      center = this_pos;
    }
  }
  *sad = best_sad;
  return (center - (bw >> 1));
}